

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  ZSTD_matchState_t *pZVar1;
  seqDef *psVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  BYTE *ip;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  ulong uVar17;
  U32 UVar18;
  U32 UVar19;
  U32 UVar20;
  size_t sVar21;
  size_t offsetFound;
  int *local_b0;
  U32 local_a4;
  size_t local_98;
  ulong local_90;
  uint local_84;
  BYTE *local_80;
  int *local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  ZSTD_matchState_t *local_50;
  seqStore_t *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  pBVar10 = (ms->window).base;
  local_84 = (ms->window).dictLimit;
  uVar17 = (ulong)local_84;
  local_80 = pBVar10 + uVar17;
  UVar19 = *rep;
  local_a4 = rep[1];
  pZVar1 = ms->dictMatchState;
  local_70 = (pZVar1->window).nextSrc;
  local_58 = (pZVar1->window).base;
  local_38 = local_58 + (pZVar1->window).dictLimit;
  ms->nextToUpdate3 = ms->nextToUpdate;
  iEnd = (BYTE *)((long)src + srcSize);
  local_78 = (int *)((long)src + (srcSize - 8));
  piVar14 = (int *)((ulong)(((int)src - (int)local_80) + (int)local_70 == (int)local_38) + (long)src
                   );
  local_40 = rep;
  if (piVar14 < local_78) {
    local_84 = ((int)local_58 - (int)local_70) + local_84;
    local_60 = local_58 + -(ulong)local_84;
    local_90 = uVar17;
    local_68 = pBVar10;
    local_50 = ms;
    local_48 = seqStore;
    do {
      uVar5 = (((int)piVar14 - (int)pBVar10) - UVar19) + 1;
      uVar9 = (uint)uVar17;
      piVar15 = (int *)(pBVar10 + uVar5);
      if (uVar5 < uVar9) {
        piVar15 = (int *)(local_58 + (uVar5 - local_84));
      }
      if ((uVar5 - uVar9 < 0xfffffffd) && (*piVar15 == *(int *)((long)piVar14 + 1))) {
        pBVar13 = iEnd;
        if (uVar5 < uVar9) {
          pBVar13 = local_70;
        }
        sVar6 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar14 + 5),(BYTE *)(piVar15 + 1),iEnd,pBVar13,local_80);
        uVar17 = sVar6 + 4;
      }
      else {
        uVar17 = 0;
      }
      local_98 = 999999999;
      sVar7 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS(local_50,(BYTE *)piVar14,iEnd,&local_98)
      ;
      sVar6 = uVar17;
      if (uVar17 < sVar7) {
        sVar6 = sVar7;
      }
      if (sVar6 < 4) {
        piVar14 = (int *)((long)piVar14 + ((long)piVar14 - (long)src >> 8) + 1);
        uVar17 = local_90;
      }
      else {
        local_b0 = piVar14;
        sVar21 = local_98;
        if (sVar7 <= uVar17) {
          local_b0 = (int *)((long)piVar14 + 1);
          sVar21 = 0;
        }
        if (piVar14 < local_78) {
          do {
            piVar15 = (int *)((long)piVar14 + 1);
            uVar5 = ((int)piVar15 - (int)local_68) - UVar19;
            piVar16 = (int *)(local_68 + uVar5);
            if (uVar5 < (uint)local_90) {
              piVar16 = (int *)(local_58 + (uVar5 - local_84));
            }
            if ((uVar5 - (uint)local_90 < 0xfffffffd) && (*piVar16 == *piVar15)) {
              pBVar10 = iEnd;
              if (uVar5 < (uint)local_90) {
                pBVar10 = local_70;
              }
              sVar7 = ZSTD_count_2segments
                                ((BYTE *)((long)piVar14 + 5),(BYTE *)(piVar16 + 1),iEnd,pBVar10,
                                 local_80);
              if (sVar7 < 0xfffffffffffffffc) {
                uVar9 = (int)sVar21 + 1;
                uVar5 = 0x1f;
                if (uVar9 != 0) {
                  for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                  }
                }
                if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 3 + -0x1e) < (int)(sVar7 + 4) * 3) {
                  sVar21 = 0;
                  sVar6 = sVar7 + 4;
                  local_b0 = piVar15;
                }
              }
            }
            local_98 = 999999999;
            sVar7 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                              (local_50,(BYTE *)piVar15,iEnd,&local_98);
            bVar4 = true;
            if (3 < sVar7) {
              uVar9 = (int)sVar21 + 1;
              uVar5 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              uVar9 = (int)local_98 + 1;
              iVar3 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 4 + -0x1b) < (int)sVar7 * 4 - iVar3) {
                bVar4 = false;
                sVar6 = sVar7;
                sVar21 = local_98;
                local_b0 = piVar15;
              }
            }
            if (bVar4) {
              if (local_78 <= piVar15) break;
              piVar15 = (int *)((long)piVar14 + 2);
              uVar5 = ((int)piVar15 - (int)local_68) - UVar19;
              piVar16 = (int *)(local_68 + uVar5);
              if (uVar5 < (uint)local_90) {
                piVar16 = (int *)(local_58 + (uVar5 - local_84));
              }
              if ((uVar5 - (uint)local_90 < 0xfffffffd) && (*piVar16 == *piVar15)) {
                pBVar10 = iEnd;
                if (uVar5 < (uint)local_90) {
                  pBVar10 = local_70;
                }
                sVar7 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar14 + 6),(BYTE *)(piVar16 + 1),iEnd,pBVar10,
                                   local_80);
                if (sVar7 < 0xfffffffffffffffc) {
                  uVar9 = (int)sVar21 + 1;
                  uVar5 = 0x1f;
                  if (uVar9 != 0) {
                    for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                    }
                  }
                  if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 4 + -0x1e) < (int)(sVar7 + 4) * 4) {
                    sVar21 = 0;
                    sVar6 = sVar7 + 4;
                    local_b0 = piVar15;
                  }
                }
              }
              local_98 = 999999999;
              sVar7 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                                (local_50,(BYTE *)piVar15,iEnd,&local_98);
              bVar4 = true;
              if (3 < sVar7) {
                uVar9 = (int)sVar21 + 1;
                uVar5 = 0x1f;
                if (uVar9 != 0) {
                  for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                  }
                }
                uVar9 = (int)local_98 + 1;
                iVar3 = 0x1f;
                if (uVar9 != 0) {
                  for (; uVar9 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                  }
                }
                if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 4 + -0x18) < (int)sVar7 * 4 - iVar3) {
                  bVar4 = false;
                  sVar6 = sVar7;
                  sVar21 = local_98;
                  local_b0 = piVar15;
                }
              }
              if (bVar4) break;
            }
            piVar14 = piVar15;
          } while (piVar14 < local_78);
        }
        pBVar10 = local_68;
        uVar17 = local_90;
        uVar5 = (uint)local_90;
        if (sVar21 == 0) {
          UVar20 = 1;
          UVar18 = UVar19;
        }
        else {
          pBVar11 = (BYTE *)((long)local_b0 + (-(long)local_68 - sVar21) + -0xfffffffe);
          pBVar12 = local_68;
          pBVar13 = local_80;
          if ((uint)pBVar11 < (uint)local_90) {
            pBVar12 = local_60;
            pBVar13 = local_38;
          }
          if ((src < local_b0) && (uVar8 = (ulong)pBVar11 & 0xffffffff, pBVar13 < pBVar12 + uVar8))
          {
            pBVar12 = pBVar12 + uVar8;
            do {
              piVar14 = (int *)((long)local_b0 + -1);
              pBVar12 = pBVar12 + -1;
              if ((*(BYTE *)piVar14 != *pBVar12) ||
                 (sVar6 = sVar6 + 1, local_b0 = piVar14, piVar14 <= src)) break;
            } while (pBVar13 < pBVar12);
          }
          UVar20 = (int)sVar21 + 1;
          UVar18 = (int)sVar21 - 2;
          local_a4 = UVar19;
        }
        uVar8 = (long)local_b0 - (long)src;
        pBVar12 = local_48->lit;
        pBVar13 = pBVar12 + uVar8;
        do {
          *(undefined8 *)pBVar12 = *src;
          pBVar12 = pBVar12 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar12 < pBVar13);
        local_48->lit = local_48->lit + uVar8;
        if (0xffff < uVar8) {
          local_48->longLengthID = 1;
          local_48->longLengthPos =
               (U32)((ulong)((long)local_48->sequences - (long)local_48->sequencesStart) >> 3);
        }
        psVar2 = local_48->sequences;
        psVar2->litLength = (U16)uVar8;
        psVar2->offset = UVar20;
        if (0xffff < sVar6 - 3) {
          local_48->longLengthID = 2;
          local_48->longLengthPos =
               (U32)((ulong)((long)psVar2 - (long)local_48->sequencesStart) >> 3);
        }
        psVar2->matchLength = (U16)(sVar6 - 3);
        local_48->sequences = psVar2 + 1;
        src = (void *)((long)local_b0 + sVar6);
        pBVar13 = local_60;
        piVar14 = (int *)src;
        do {
          UVar19 = UVar18;
          if (local_78 < piVar14) break;
          uVar9 = ((int)piVar14 - (int)pBVar10) - local_a4;
          pBVar12 = pBVar10;
          if (uVar9 < uVar5) {
            pBVar12 = pBVar13;
          }
          if ((uVar9 - uVar5 < 0xfffffffd) && (*(int *)(pBVar12 + uVar9) == *piVar14)) {
            pBVar13 = iEnd;
            if (uVar9 < uVar5) {
              pBVar13 = local_70;
            }
            sVar6 = ZSTD_count_2segments
                              ((BYTE *)(piVar14 + 1),(BYTE *)((long)(pBVar12 + uVar9) + 4),iEnd,
                               pBVar13,local_80);
            *(undefined8 *)local_48->lit = *src;
            psVar2 = local_48->sequences;
            psVar2->litLength = 0;
            psVar2->offset = 1;
            if (0xffff < sVar6 + 1) {
              local_48->longLengthID = 2;
              local_48->longLengthPos =
                   (U32)((ulong)((long)psVar2 - (long)local_48->sequencesStart) >> 3);
            }
            psVar2->matchLength = (U16)(sVar6 + 1);
            local_48->sequences = psVar2 + 1;
            src = (void *)((long)piVar14 + sVar6 + 4);
            bVar4 = true;
            pBVar13 = local_60;
            piVar14 = (int *)src;
            UVar18 = local_a4;
          }
          else {
            bVar4 = false;
            UVar19 = local_a4;
          }
          local_a4 = UVar19;
          UVar19 = UVar18;
        } while (bVar4);
      }
    } while (piVar14 < local_78);
  }
  *local_40 = UVar19;
  local_40[1] = local_a4;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 1, 2, ZSTD_dictMatchState);
}